

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cc
# Opt level: O1

void __thiscall
tchecker::assign_statement_t::assign_statement_t
          (assign_statement_t *this,shared_ptr<const_tchecker::lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::expression_t> *rvalue)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  invalid_argument *this_00;
  
  *(undefined ***)this = &PTR__assign_statement_t_002476c8;
  (this->_lvalue).
  super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (lvalue->super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>)
       ._M_ptr;
  p_Var1 = (lvalue->
           super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_lvalue).
  super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->_rvalue).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (rvalue->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var1 = (rvalue->super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->_rvalue).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if ((this->_lvalue).
      super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr lvalue");
  }
  else {
    if ((this->_rvalue).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"nullptr rvalue");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

assign_statement_t::assign_statement_t(std::shared_ptr<tchecker::lvalue_expression_t const> const & lvalue,
                                       std::shared_ptr<tchecker::expression_t const> const & rvalue)
    : _lvalue(lvalue), _rvalue(rvalue)
{
  if (_lvalue.get() == nullptr)
    throw std::invalid_argument("nullptr lvalue");
  if (_rvalue.get() == nullptr)
    throw std::invalid_argument("nullptr rvalue");
}